

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

StringNew * __thiscall
wasm::Builder::makeStringNew
          (Builder *this,StringNewOp op,Expression *ref,Expression *start,Expression *end)

{
  StringNew *pSVar1;
  
  if ((op != StringNewFromCodePoint) == (end != (Expression *)0x0 && start != (Expression *)0x0)) {
    pSVar1 = (StringNew *)MixedArena::allocSpace((MixedArena *)(this->wasm + 0x200),0x30,8);
    (pSVar1->super_SpecificExpression<(wasm::Expression::Id)82>).super_Expression._id = StringNewId;
    (pSVar1->super_SpecificExpression<(wasm::Expression::Id)82>).super_Expression.type.id = 0;
    pSVar1->start = (Expression *)0x0;
    pSVar1->end = (Expression *)0x0;
    pSVar1->op = op;
    pSVar1->ref = ref;
    pSVar1->start = start;
    pSVar1->end = end;
    wasm::StringNew::finalize();
    return pSVar1;
  }
  __assert_fail("(start && end) != (op == StringNewFromCodePoint)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x461,
                "StringNew *wasm::Builder::makeStringNew(StringNewOp, Expression *, Expression *, Expression *)"
               );
}

Assistant:

StringNew* makeStringNew(StringNewOp op,
                           Expression* ref,
                           Expression* start = nullptr,
                           Expression* end = nullptr) {
    assert((start && end) != (op == StringNewFromCodePoint));
    auto* ret = wasm.allocator.alloc<StringNew>();
    ret->op = op;
    ret->ref = ref;
    ret->start = start;
    ret->end = end;
    ret->finalize();
    return ret;
  }